

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::Tree(Tree *this,Tree *that)

{
  Tree *in_stack_000001b8;
  Tree *in_stack_000001c0;
  
  Tree(this,(Callbacks *)that);
  _copy(in_stack_000001c0,in_stack_000001b8);
  return;
}

Assistant:

Tree::Tree(Tree const& that) noexcept : Tree(that.m_callbacks)
{
    _copy(that);
}